

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

_Bool Curl_conncache_foreach
                (Curl_easy *data,conncache *connc,void *param,
                _func_int_Curl_easy_ptr_connectdata_ptr_void_ptr *func)

{
  Curl_llist_element *pCVar1;
  int iVar2;
  connectdata *conn;
  connectbundle *bundle;
  Curl_hash_element *he;
  Curl_llist_element *curr;
  Curl_hash_iterator iter;
  _func_int_Curl_easy_ptr_connectdata_ptr_void_ptr *func_local;
  void *param_local;
  conncache *connc_local;
  Curl_easy *data_local;
  
  if (connc != (conncache *)0x0) {
    iter.current_element = (Curl_llist_element *)func;
    if (data->share != (Curl_share *)0x0) {
      Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    Curl_hash_start_iterate(&connc->hash,(Curl_hash_iterator *)&curr);
    bundle = (connectbundle *)Curl_hash_next_element((Curl_hash_iterator *)&curr);
    while (bundle != (connectbundle *)0x0) {
      pCVar1 = (bundle->conn_list).tail;
      bundle = (connectbundle *)Curl_hash_next_element((Curl_hash_iterator *)&curr);
      he = (Curl_hash_element *)pCVar1->next;
      while (he != (Curl_hash_element *)0x0) {
        pCVar1 = &he->list;
        he = (Curl_hash_element *)(he->list).next;
        iVar2 = (*(code *)iter.current_element)(data,pCVar1->ptr,param);
        if (iVar2 == 1) {
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
          }
          return true;
        }
      }
    }
    if (data->share != (Curl_share *)0x0) {
      Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
    }
  }
  return false;
}

Assistant:

bool Curl_conncache_foreach(struct Curl_easy *data,
                            struct conncache *connc,
                            void *param,
                            int (*func)(struct Curl_easy *data,
                                        struct connectdata *conn, void *param))
{
  struct Curl_hash_iterator iter;
  struct Curl_llist_element *curr;
  struct Curl_hash_element *he;

  if(!connc)
    return FALSE;

  CONNCACHE_LOCK(data);
  Curl_hash_start_iterate(&connc->hash, &iter);

  he = Curl_hash_next_element(&iter);
  while(he) {
    struct connectbundle *bundle;

    bundle = he->ptr;
    he = Curl_hash_next_element(&iter);

    curr = bundle->conn_list.head;
    while(curr) {
      /* Yes, we need to update curr before calling func(), because func()
         might decide to remove the connection */
      struct connectdata *conn = curr->ptr;
      curr = curr->next;

      if(1 == func(data, conn, param)) {
        CONNCACHE_UNLOCK(data);
        return TRUE;
      }
    }
  }
  CONNCACHE_UNLOCK(data);
  return FALSE;
}